

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_inherit_streams(void)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uv_loop_t *loop;
  char *pcVar4;
  long lVar5;
  int fds_stdout [2];
  int fds_stdin [2];
  undefined1 local_9c8 [16];
  uv_stdio_container_t child_stdio [2];
  uv_pipe_t pipe_stdout_parent;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_child;
  uv_process_t child_req;
  uv_write_t write_req;
  uchar ubuf [1023];
  
  init_process_options("spawn_helper9",exit_cb);
  uVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar3,&pipe_stdin_child,0);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_init(uVar3,&pipe_stdout_child,0);
    if (iVar1 == 0) {
      iVar1 = uv_pipe_init(uVar3,&pipe_stdin_parent,0);
      if (iVar1 == 0) {
        iVar1 = uv_pipe_init(uVar3,&pipe_stdout_parent,0);
        if (iVar1 == 0) {
          iVar1 = uv_pipe(fds_stdin,0,0);
          if (iVar1 == 0) {
            iVar1 = uv_pipe(fds_stdout,0,0);
            if (iVar1 == 0) {
              iVar1 = uv_pipe_open(&pipe_stdin_child,fds_stdin[0]);
              if (iVar1 == 0) {
                iVar1 = uv_pipe_open(&pipe_stdout_child,fds_stdout[1]);
                if (iVar1 == 0) {
                  iVar1 = uv_pipe_open(&pipe_stdin_parent,fds_stdin[1]);
                  if (iVar1 == 0) {
                    iVar1 = uv_pipe_open(&pipe_stdout_parent,fds_stdout[0]);
                    if (iVar1 == 0) {
                      iVar1 = uv_is_readable(&pipe_stdin_child);
                      if (iVar1 == 0) {
                        pcVar4 = "uv_is_readable((uv_stream_t*) &pipe_stdin_child)";
                        uVar3 = 0x719;
                      }
                      else {
                        iVar1 = uv_is_writable(&pipe_stdout_child);
                        if (iVar1 == 0) {
                          pcVar4 = "uv_is_writable((uv_stream_t*) &pipe_stdout_child)";
                          uVar3 = 0x71a;
                        }
                        else {
                          iVar1 = uv_is_writable(&pipe_stdin_parent);
                          if (iVar1 == 0) {
                            pcVar4 = "uv_is_writable((uv_stream_t*) &pipe_stdin_parent)";
                            uVar3 = 0x71b;
                          }
                          else {
                            iVar1 = uv_is_readable(&pipe_stdout_parent);
                            if (iVar1 == 0) {
                              pcVar4 = "uv_is_readable((uv_stream_t*) &pipe_stdout_parent)";
                              uVar3 = 0x71c;
                            }
                            else {
                              iVar1 = uv_is_writable((uv_stream_t *)&pipe_stdin_child);
                              iVar2 = uv_is_readable((uv_stream_t *)&pipe_stdout_child);
                              if (iVar2 == iVar1) {
                                iVar2 = uv_is_readable(&pipe_stdin_parent);
                                if (iVar2 == iVar1) {
                                  iVar2 = uv_is_writable(&pipe_stdout_parent);
                                  if (iVar2 == iVar1) {
                                    options.stdio = child_stdio;
                                    child_stdio[0].flags = UV_INHERIT_STREAM;
                                    options.stdio_count = 2;
                                    child_stdio[0].data.stream = (uv_stream_t *)&pipe_stdin_child;
                                    child_stdio[1].flags = child_stdio[0].flags;
                                    child_stdio[1].data.stream = (uv_stream_t *)&pipe_stdout_child;
                                    iVar1 = uv_spawn(uVar3,&child_req,&options);
                                    if (iVar1 == 0) {
                                      uv_close(&pipe_stdin_child,0);
                                      uv_close(&pipe_stdout_child,0);
                                      local_9c8 = uv_buf_init(ubuf);
                                      for (lVar5 = 0; lVar5 != 0x3ff; lVar5 = lVar5 + 1) {
                                        ubuf[lVar5] = (uchar)lVar5;
                                      }
                                      memset(output,0,0x3ff);
                                      iVar1 = uv_write(&write_req,&pipe_stdin_parent,local_9c8,1,
                                                       write_cb);
                                      if (iVar1 == 0) {
                                        iVar1 = uv_read_start(&pipe_stdout_parent,on_alloc,on_read);
                                        if (iVar1 == 0) {
                                          iVar1 = uv_run(uVar3,0);
                                          if (iVar1 == 0) {
                                            if (exit_cb_called == 1) {
                                              if (close_cb_called == 3) {
                                                iVar1 = bcmp(ubuf,output,0x3ff);
                                                if (iVar1 == 0) {
                                                  loop = (uv_loop_t *)uv_default_loop();
                                                  close_loop(loop);
                                                  uVar3 = uv_default_loop();
                                                  iVar1 = uv_loop_close(uVar3);
                                                  if (iVar1 == 0) {
                                                    uv_library_shutdown();
                                                    return 0;
                                                  }
                                                  pcVar4 = "0 == uv_loop_close(uv_default_loop())";
                                                  uVar3 = 0x749;
                                                }
                                                else {
                                                  pcVar4 = "r == 0";
                                                  uVar3 = 0x747;
                                                }
                                              }
                                              else {
                                                pcVar4 = "close_cb_called == 3";
                                                uVar3 = 0x744;
                                              }
                                            }
                                            else {
                                              pcVar4 = "exit_cb_called == 1";
                                              uVar3 = 0x743;
                                            }
                                          }
                                          else {
                                            pcVar4 = "r == 0";
                                            uVar3 = 0x741;
                                          }
                                        }
                                        else {
                                          pcVar4 = "r == 0";
                                          uVar3 = 0x73e;
                                        }
                                      }
                                      else {
                                        pcVar4 = "r == 0";
                                        uVar3 = 0x73b;
                                      }
                                    }
                                    else {
                                      pcVar4 = "uv_spawn(loop, &child_req, &options) == 0";
                                      uVar3 = 0x72c;
                                    }
                                  }
                                  else {
                                    pcVar4 = 
                                    "uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir";
                                    uVar3 = 0x721;
                                  }
                                }
                                else {
                                  pcVar4 = 
                                  "uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir";
                                  uVar3 = 0x720;
                                }
                              }
                              else {
                                pcVar4 = 
                                "uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir";
                                uVar3 = 0x71f;
                              }
                            }
                          }
                        }
                      }
                    }
                    else {
                      pcVar4 = "uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0";
                      uVar3 = 0x718;
                    }
                  }
                  else {
                    pcVar4 = "uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0";
                    uVar3 = 0x717;
                  }
                }
                else {
                  pcVar4 = "uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0";
                  uVar3 = 0x716;
                }
              }
              else {
                pcVar4 = "uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0";
                uVar3 = 0x715;
              }
            }
            else {
              pcVar4 = "uv_pipe(fds_stdout, 0, 0) == 0";
              uVar3 = 0x713;
            }
          }
          else {
            pcVar4 = "uv_pipe(fds_stdin, 0, 0) == 0";
            uVar3 = 0x712;
          }
        }
        else {
          pcVar4 = "uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0";
          uVar3 = 0x710;
        }
      }
      else {
        pcVar4 = "uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0";
        uVar3 = 0x70f;
      }
    }
    else {
      pcVar4 = "uv_pipe_init(loop, &pipe_stdout_child, 0) == 0";
      uVar3 = 0x70e;
    }
  }
  else {
    pcVar4 = "uv_pipe_init(loop, &pipe_stdin_child, 0) == 0";
    uVar3 = 0x70d;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-spawn.c",
          uVar3,pcVar4);
  abort();
}

Assistant:

TEST_IMPL(spawn_inherit_streams) {
  uv_process_t child_req;
  uv_stdio_container_t child_stdio[2];
  int fds_stdin[2];
  int fds_stdout[2];
  uv_pipe_t pipe_stdin_child;
  uv_pipe_t pipe_stdout_child;
  uv_pipe_t pipe_stdin_parent;
  uv_pipe_t pipe_stdout_parent;
  unsigned char ubuf[OUTPUT_SIZE - 1];
  uv_buf_t buf;
  unsigned int i;
  int r;
  int bidir;
  uv_write_t write_req;
  uv_loop_t* loop;

  init_process_options("spawn_helper9", exit_cb);

  loop = uv_default_loop();
  ASSERT(uv_pipe_init(loop, &pipe_stdin_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_child, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdin_parent, 0) == 0);
  ASSERT(uv_pipe_init(loop, &pipe_stdout_parent, 0) == 0);

  ASSERT(uv_pipe(fds_stdin, 0, 0) == 0);
  ASSERT(uv_pipe(fds_stdout, 0, 0) == 0);

  ASSERT(uv_pipe_open(&pipe_stdin_child, fds_stdin[0]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_child, fds_stdout[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdin_parent, fds_stdin[1]) == 0);
  ASSERT(uv_pipe_open(&pipe_stdout_parent, fds_stdout[0]) == 0);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_child));
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdin_parent));
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_parent));
  /* Some systems (SVR4) open a bidirectional pipe, most don't. */
  bidir = uv_is_writable((uv_stream_t*) &pipe_stdin_child);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdout_child) == bidir);
  ASSERT(uv_is_readable((uv_stream_t*) &pipe_stdin_parent) == bidir);
  ASSERT(uv_is_writable((uv_stream_t*) &pipe_stdout_parent) == bidir);

  child_stdio[0].flags = UV_INHERIT_STREAM;
  child_stdio[0].data.stream = (uv_stream_t *) &pipe_stdin_child;

  child_stdio[1].flags = UV_INHERIT_STREAM;
  child_stdio[1].data.stream = (uv_stream_t *) &pipe_stdout_child;

  options.stdio = child_stdio;
  options.stdio_count = 2;

  ASSERT(uv_spawn(loop, &child_req, &options) == 0);

  uv_close((uv_handle_t*) &pipe_stdin_child, NULL);
  uv_close((uv_handle_t*) &pipe_stdout_child, NULL);

  buf = uv_buf_init((char*) ubuf, sizeof ubuf);
  for (i = 0; i < sizeof ubuf; ++i)
    ubuf[i] = i & 255u;
  memset(output, 0, sizeof ubuf);

  r = uv_write(&write_req,
               (uv_stream_t*) &pipe_stdin_parent,
               &buf,
               1,
               write_cb);
  ASSERT(r == 0);

  r = uv_read_start((uv_stream_t*) &pipe_stdout_parent, on_alloc, on_read);
  ASSERT(r == 0);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 3);

  r = memcmp(ubuf, output, sizeof ubuf);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}